

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzer.cpp
# Opt level: O0

void __thiscall HdmiCecAnalyzer::HdmiCecAnalyzer(HdmiCecAnalyzer *this)

{
  HdmiCecAnalyzerSettings *this_00;
  HdmiCecAnalyzer *this_local;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__HdmiCecAnalyzer_00110ca8;
  this_00 = (HdmiCecAnalyzerSettings *)operator_new(0x28);
  HdmiCecAnalyzerSettings::HdmiCecAnalyzerSettings(this_00);
  std::auto_ptr<HdmiCecAnalyzerSettings>::auto_ptr(&this->mSettings,this_00);
  std::auto_ptr<HdmiCecAnalyzerResults>::auto_ptr(&this->mResults,(element_type *)0x0);
  HdmiCecSimulationDataGenerator::HdmiCecSimulationDataGenerator(&this->mSimulationDataGenerator);
  this->mSimulationInitilized = false;
  std::auto_ptr<HdmiCecAnalyzerSettings>::get(&this->mSettings);
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  return;
}

Assistant:

HdmiCecAnalyzer::HdmiCecAnalyzer() : Analyzer2(), mSettings( new HdmiCecAnalyzerSettings() ), mSimulationInitilized( false )
{
    SetAnalyzerSettings( mSettings.get() );
}